

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O1

void SuperSpread_Test_Hitter<4u>(string *PATH)

{
  size_type *psVar1;
  char *pcVar2;
  undefined8 uVar3;
  code *pcVar4;
  Abstract<4U> *this;
  bool bVar5;
  char cVar6;
  pointer ppbVar7;
  size_type *psVar8;
  __node_base_ptr p_Var9;
  value_type *__val;
  basic_ostream<char,_std::char_traits<char>_> *pbVar10;
  long *plVar11;
  WavingSketch<8U,_16U,_4U> *this_00;
  TLF<4U> *this_01;
  OLF<4U> *this_02;
  OpenSketch<4U> *this_03;
  SpreadSketchWrapper<4U> *this_04;
  ostream *poVar12;
  iterator iVar13;
  mapped_type *pmVar14;
  iterator iVar15;
  mapped_type *pmVar16;
  size_type *psVar17;
  __hashtable_alloc *p_Var18;
  basic_ostream<char,_std::char_traits<char>_> **out_3;
  undefined8 *puVar19;
  pointer ppbVar20;
  undefined1 *puVar21;
  ulong uVar22;
  int iVar23;
  basic_ostream<char,_std::char_traits<char>_> **out_1;
  pointer ppbVar24;
  long lVar25;
  uint32_t j;
  long lVar26;
  undefined1 auStack_368 [8];
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_Data<4U>,_int>,_true>_>_>
  local_360;
  ofstream out;
  long local_350;
  long lStack_348;
  ios_base local_268 [264];
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_160;
  pointer local_128;
  undefined1 *local_120;
  string *local_118;
  __hashtable_alloc *local_110;
  undefined8 local_108;
  int local_fc;
  size_type *local_f8;
  string file;
  key_type local_cc;
  undefined1 auStack_c8 [4];
  Data<4U> from;
  HashMap<4U> mp;
  pointer ppbStack_88;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  outs;
  int cnt;
  Data<4U> to;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  __node_base_ptr p_Stack_38;
  
  ppbStack_88 = (pointer)0x0;
  outs.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outs.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118 = PATH;
  ppbStack_88 = (pointer)operator_new(0x20);
  outs.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = ppbStack_88 + 4;
  *ppbStack_88 = (basic_ostream<char,_std::char_traits<char>_> *)0x0;
  ppbStack_88[1] = (basic_ostream<char,_std::char_traits<char>_> *)0x0;
  ppbStack_88[2] = (basic_ostream<char,_std::char_traits<char>_> *)0x0;
  ppbStack_88[3] = (basic_ostream<char,_std::char_traits<char>_> *)0x0;
  local_f8 = &file._M_string_length;
  outs.
  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       outs.
       super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"caida","");
  pbVar10 = (basic_ostream<char,_std::char_traits<char>_> *)operator_new(0x200);
  _cnt = &__str._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&cnt,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&cnt);
  plVar11 = (long *)std::__cxx11::string::_M_append((char *)&cnt,(ulong)local_f8);
  psVar1 = &mp._M_h._M_bucket_count;
  psVar17 = (size_type *)(plVar11 + 2);
  if ((size_type *)*plVar11 == psVar17) {
    mp._M_h._M_bucket_count = *psVar17;
    mp._M_h._M_before_begin._M_nxt = (_Hash_node_base *)plVar11[3];
    _auStack_c8 = psVar1;
  }
  else {
    mp._M_h._M_bucket_count = *psVar17;
    _auStack_c8 = (size_type *)*plVar11;
  }
  mp._M_h._M_buckets = (__buckets_ptr)plVar11[1];
  *plVar11 = (long)psVar17;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append(auStack_c8);
  p_Var18 = (__hashtable_alloc *)(plVar11 + 2);
  if ((__hashtable_alloc *)*plVar11 == p_Var18) {
    local_350 = *(long *)p_Var18;
    lStack_348 = plVar11[3];
    local_360._M_h = (__hashtable_alloc *)&local_350;
  }
  else {
    local_350 = *(long *)p_Var18;
    local_360._M_h = (__hashtable_alloc *)*plVar11;
  }
  _out = plVar11[1];
  *plVar11 = (long)p_Var18;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  std::ofstream::ofstream(pbVar10,(string *)&local_360,_S_out);
  *ppbStack_88 = pbVar10;
  if (local_360._M_h != (__hashtable_alloc *)&local_350) {
    operator_delete(local_360._M_h,local_350 + 1);
  }
  if (_auStack_c8 != psVar1) {
    operator_delete(_auStack_c8,mp._M_h._M_bucket_count + 1);
  }
  if (_cnt != &__str._M_string_length) {
    operator_delete(_cnt,__str._M_string_length + 1);
  }
  pbVar10 = (basic_ostream<char,_std::char_traits<char>_> *)operator_new(0x200);
  _cnt = &__str._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&cnt,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&cnt);
  plVar11 = (long *)std::__cxx11::string::_M_append((char *)&cnt,(ulong)local_f8);
  psVar17 = (size_type *)(plVar11 + 2);
  if ((size_type *)*plVar11 == psVar17) {
    mp._M_h._M_bucket_count = *psVar17;
    mp._M_h._M_before_begin._M_nxt = (_Hash_node_base *)plVar11[3];
    _auStack_c8 = psVar1;
  }
  else {
    mp._M_h._M_bucket_count = *psVar17;
    _auStack_c8 = (size_type *)*plVar11;
  }
  mp._M_h._M_buckets = (__buckets_ptr)plVar11[1];
  *plVar11 = (long)psVar17;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append(auStack_c8);
  p_Var18 = (__hashtable_alloc *)(plVar11 + 2);
  if ((__hashtable_alloc *)*plVar11 == p_Var18) {
    local_350 = *(long *)p_Var18;
    lStack_348 = plVar11[3];
    local_360._M_h = (__hashtable_alloc *)&local_350;
  }
  else {
    local_350 = *(long *)p_Var18;
    local_360._M_h = (__hashtable_alloc *)*plVar11;
  }
  _out = plVar11[1];
  *plVar11 = (long)p_Var18;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  std::ofstream::ofstream(pbVar10,(string *)&local_360,_S_out);
  ppbStack_88[1] = pbVar10;
  if (local_360._M_h != (__hashtable_alloc *)&local_350) {
    operator_delete(local_360._M_h,local_350 + 1);
  }
  if (_auStack_c8 != psVar1) {
    operator_delete(_auStack_c8,mp._M_h._M_bucket_count + 1);
  }
  if (_cnt != &__str._M_string_length) {
    operator_delete(_cnt,__str._M_string_length + 1);
  }
  pbVar10 = (basic_ostream<char,_std::char_traits<char>_> *)operator_new(0x200);
  _cnt = &__str._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&cnt,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&cnt);
  plVar11 = (long *)std::__cxx11::string::_M_append((char *)&cnt,(ulong)local_f8);
  psVar17 = (size_type *)(plVar11 + 2);
  if ((size_type *)*plVar11 == psVar17) {
    mp._M_h._M_bucket_count = *psVar17;
    mp._M_h._M_before_begin._M_nxt = (_Hash_node_base *)plVar11[3];
    _auStack_c8 = psVar1;
  }
  else {
    mp._M_h._M_bucket_count = *psVar17;
    _auStack_c8 = (size_type *)*plVar11;
  }
  mp._M_h._M_buckets = (__buckets_ptr)plVar11[1];
  *plVar11 = (long)psVar17;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append(auStack_c8);
  p_Var18 = (__hashtable_alloc *)(plVar11 + 2);
  if ((__hashtable_alloc *)*plVar11 == p_Var18) {
    local_350 = *(long *)p_Var18;
    lStack_348 = plVar11[3];
    local_360._M_h = (__hashtable_alloc *)&local_350;
  }
  else {
    local_350 = *(long *)p_Var18;
    local_360._M_h = (__hashtable_alloc *)*plVar11;
  }
  _out = plVar11[1];
  *plVar11 = (long)p_Var18;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  std::ofstream::ofstream(pbVar10,(string *)&local_360,_S_out);
  ppbStack_88[2] = pbVar10;
  if (local_360._M_h != (__hashtable_alloc *)&local_350) {
    operator_delete(local_360._M_h,local_350 + 1);
  }
  if (_auStack_c8 != psVar1) {
    operator_delete(_auStack_c8,mp._M_h._M_bucket_count + 1);
  }
  if (_cnt != &__str._M_string_length) {
    operator_delete(_cnt,__str._M_string_length + 1);
  }
  pbVar10 = (basic_ostream<char,_std::char_traits<char>_> *)operator_new(0x200);
  _cnt = &__str._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&cnt,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)&cnt);
  plVar11 = (long *)std::__cxx11::string::_M_append((char *)&cnt,(ulong)local_f8);
  psVar17 = (size_type *)(plVar11 + 2);
  if ((size_type *)*plVar11 == psVar17) {
    mp._M_h._M_bucket_count = *psVar17;
    mp._M_h._M_before_begin._M_nxt = (_Hash_node_base *)plVar11[3];
    _auStack_c8 = psVar1;
  }
  else {
    mp._M_h._M_bucket_count = *psVar17;
    _auStack_c8 = (size_type *)*plVar11;
  }
  mp._M_h._M_buckets = (__buckets_ptr)plVar11[1];
  *plVar11 = (long)psVar17;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append(auStack_c8);
  p_Var18 = (__hashtable_alloc *)(plVar11 + 2);
  if ((__hashtable_alloc *)*plVar11 == p_Var18) {
    local_350 = *(long *)p_Var18;
    lStack_348 = plVar11[3];
    local_360._M_h = (__hashtable_alloc *)&local_350;
  }
  else {
    local_350 = *(long *)p_Var18;
    local_360._M_h = (__hashtable_alloc *)*plVar11;
  }
  _out = plVar11[1];
  *plVar11 = (long)p_Var18;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  std::ofstream::ofstream(pbVar10,(string *)&local_360,_S_out);
  ppbStack_88[3] = pbVar10;
  if (local_360._M_h != (__hashtable_alloc *)&local_350) {
    operator_delete(local_360._M_h,local_350 + 1);
  }
  if (_auStack_c8 != psVar1) {
    operator_delete(_auStack_c8,mp._M_h._M_bucket_count + 1);
  }
  if (_cnt != &__str._M_string_length) {
    operator_delete(_cnt,__str._M_string_length + 1);
  }
  local_110 = _VTT;
  local_108 = _log;
  iVar23 = 0;
  puVar21 = auStack_368;
  do {
    mp._M_h._M_single_bucket = (__node_base_ptr)(ulong)(iVar23 * 100000 + 600000);
    file.field_2._8_8_ = (ulong)mp._M_h._M_single_bucket / 1000;
    *(undefined8 *)(puVar21 + -8) = 0x107c99;
    printf("\x1b[0m\x1b[1;4;36m> Memory size: %dKB\n\x1b[0m");
    puVar19 = (undefined8 *)(puVar21 + -0x30);
    local_120 = puVar21;
    *(undefined8 *)(puVar21 + -0x38) = 0x107cb4;
    this_00 = (WavingSketch<8U,_16U,_4U> *)operator_new(0xa8);
    p_Var9 = mp._M_h._M_single_bucket;
    *(undefined8 *)(puVar21 + -0x38) = 0x107cd0;
    WavingSketch<8U,_16U,_4U>::WavingSketch(this_00,(int)p_Var9,0x54,3);
    *puVar19 = this_00;
    *(undefined8 *)(puVar21 + -0x38) = 0x107cdd;
    this_01 = (TLF<4U> *)operator_new(0x120);
    p_Var9 = mp._M_h._M_single_bucket;
    *(undefined8 *)(puVar21 + -0x38) = 0x107cf4;
    TLF<4U>::TLF(this_01,(int)p_Var9,0x54);
    *(TLF<4U> **)(puVar21 + -0x28) = this_01;
    *(undefined8 *)(puVar21 + -0x38) = 0x107d02;
    this_02 = (OLF<4U> *)operator_new(0xe8);
    p_Var9 = mp._M_h._M_single_bucket;
    *(undefined8 *)(puVar21 + -0x38) = 0x107d19;
    OLF<4U>::OLF(this_02,(int)p_Var9,0x54);
    *(OLF<4U> **)(puVar21 + -0x20) = this_02;
    *(undefined8 *)(puVar21 + -0x38) = 0x107d27;
    this_03 = (OpenSketch<4U> *)operator_new(0xd0);
    p_Var9 = mp._M_h._M_single_bucket;
    *(undefined8 *)(puVar21 + -0x38) = 0x107d3e;
    OpenSketch<4U>::OpenSketch(this_03,(int)p_Var9,0x54);
    *(OpenSketch<4U> **)(puVar21 + -0x18) = this_03;
    *(undefined8 *)(puVar21 + -0x38) = 0x107d4c;
    this_04 = (SpreadSketchWrapper<4U> *)operator_new(0x78);
    p_Var9 = mp._M_h._M_single_bucket;
    *(undefined8 *)(puVar21 + -0x38) = 0x107d63;
    SpreadSketchWrapper<4U>::SpreadSketchWrapper(this_04,(int)p_Var9,0x54);
    *(SpreadSketchWrapper<4U> **)(puVar21 + -0x10) = this_04;
    ppbVar20 = ppbStack_88;
    local_fc = iVar23;
    ppbVar7 = outs.
              super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((iVar23 == 0) &&
       (local_128 = outs.
                    super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start, ppbVar24 = ppbStack_88,
       ppbStack_88 !=
       outs.
       super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_start)) {
      do {
        poVar12 = (ostream *)*ppbVar24;
        *(undefined8 *)(puVar21 + -0x38) = 0x107da7;
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"MEM(KB)",7);
        *(undefined8 *)(puVar21 + -0x38) = 0x107dbb;
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,",",1);
        lVar26 = 0;
        do {
          poVar12 = (ostream *)*ppbVar24;
          pcVar2 = *(char **)(puVar19[lVar26] + 8);
          lVar25 = *(long *)(puVar19[lVar26] + 0x10);
          *(undefined8 *)(puVar21 + -0x38) = 0x107dd3;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar2,lVar25);
          *(undefined8 *)(puVar21 + -0x38) = 0x107de7;
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,",",1);
          lVar26 = lVar26 + 1;
        } while (lVar26 != 5);
        uVar3 = *(undefined8 *)(*(long *)*ppbVar24 + -0x18);
        cVar6 = (char)*ppbVar24;
        *(undefined8 *)(puVar21 + -0x38) = 0x107e08;
        std::ios::widen((char)uVar3 + cVar6);
        *(undefined8 *)(puVar21 + -0x38) = 0x107e13;
        std::ostream::put(cVar6);
        *(undefined8 *)(puVar21 + -0x38) = 0x107e1b;
        std::ostream::flush();
        ppbVar24 = ppbVar24 + 1;
        ppbVar20 = ppbStack_88;
        ppbVar7 = outs.
                  super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (ppbVar24 != local_128);
    }
    for (; uVar3 = file.field_2._8_8_, ppbVar20 != ppbVar7; ppbVar20 = ppbVar20 + 1) {
      poVar12 = (ostream *)*ppbVar20;
      *(undefined8 *)(puVar21 + -0x38) = 0x107e48;
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,(int)uVar3);
      *(undefined8 *)(puVar21 + -0x38) = 0x107e5c;
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,",",1);
    }
    _auStack_c8 = &mp._M_h._M_rehash_policy._M_next_resize;
    mp._M_h._M_buckets = (__buckets_ptr)0x1;
    mp._M_h._M_bucket_count = 0;
    mp._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    mp._M_h._M_element_count._0_4_ = 1.0;
    mp._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    mp._M_h._M_rehash_policy._4_4_ = 0;
    mp._M_h._M_rehash_policy._M_next_resize = 0;
    _cnt = (size_type *)&p_Stack_38;
    __str._M_dataplus._M_p = (pointer)0x1;
    __str._M_string_length = 0;
    __str.field_2._M_allocated_capacity = 0;
    __str.field_2._8_4_ = 0x3f800000;
    p_Stack_38 = (__node_base_ptr)0x0;
    pcVar2 = (local_118->_M_dataplus)._M_p;
    *(undefined8 *)(puVar21 + -0x38) = 0x107ed0;
    file.field_2._8_8_ =
         read_standard_pair_data<4u>
                   (pcVar2,record_length,
                    (int *)&outs.
                            super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_cc.str[0] = '\0';
    local_cc.str[1] = '\0';
    local_cc.str[2] = '\0';
    local_cc.str[3] = '\0';
    outs.
    super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    iVar23 = 10000000;
    if ((int)outs.
             super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage < 10000000) {
      iVar23 = (int)outs.
                    super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    bVar5 = 0 < (int)outs.
                     super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
    outs.
    super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = iVar23;
    if (bVar5) {
      lVar26 = 0;
      do {
        local_cc.str = *(uchar (*) [4])(file.field_2._8_8_ + lVar26 * 8);
        outs.
        super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             *(undefined4 *)(file.field_2._8_8_ + 4 + lVar26 * 8);
        local_360._M_h._4_4_ =
             outs.
             super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        local_360._M_h._0_1_ = local_cc.str[0];
        local_360._M_h._1_1_ = local_cc.str[1];
        local_360._M_h._2_1_ = local_cc.str[2];
        local_360._M_h._3_1_ = local_cc.str[3];
        *(undefined8 *)(puVar21 + -0x38) = 0x107f32;
        iVar13 = std::
                 _Hashtable<Stream<4U>,_std::pair<const_Stream<4U>,_int>,_std::allocator<std::pair<const_Stream<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Stream<4U>_>,_Stream_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<Stream<4U>,_std::pair<const_Stream<4U>,_int>,_std::allocator<std::pair<const_Stream<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Stream<4U>_>,_Stream_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&cnt,(key_type *)&local_360);
        if (iVar13.super__Node_iterator_base<std::pair<const_Stream<4U>,_int>,_true>._M_cur ==
            (__node_type *)0x0) {
          *(undefined8 *)(puVar21 + -0x38) = 0x107f47;
          pmVar14 = std::__detail::
                    _Map_base<Stream<4U>,_std::pair<const_Stream<4U>,_int>,_std::allocator<std::pair<const_Stream<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Stream<4U>_>,_Stream_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<Stream<4U>,_std::pair<const_Stream<4U>,_int>,_std::allocator<std::pair<const_Stream<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Stream<4U>_>,_Stream_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&cnt,(key_type *)&local_360);
          *pmVar14 = 1;
          *(undefined8 *)(puVar21 + -0x38) = 0x107f5c;
          iVar15 = std::
                   _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)auStack_c8,&local_cc);
          if (iVar15.super__Node_iterator_base<std::pair<const_Data<4U>,_int>,_true>._M_cur ==
              (__node_type *)0x0) {
            *(undefined8 *)(puVar21 + -0x38) = 0x107f83;
            pmVar16 = std::__detail::
                      _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)auStack_c8,&local_cc);
            *pmVar16 = 1;
          }
          else {
            *(undefined8 *)(puVar21 + -0x38) = 0x107f70;
            pmVar16 = std::__detail::
                      _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)auStack_c8,&local_cc);
            *pmVar16 = *pmVar16 + 1;
          }
        }
        lVar25 = 0;
        do {
          plVar11 = (long *)puVar19[lVar25];
          pcVar4 = *(code **)(*plVar11 + 0x28);
          *(undefined8 *)(puVar21 + -0x38) = 0x107f9c;
          (*pcVar4)(plVar11,&local_cc,
                    (undefined1 *)
                    ((long)&outs.
                            super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
          lVar25 = lVar25 + 1;
        } while (lVar25 != 5);
        lVar26 = lVar26 + 1;
      } while (lVar26 < (int)outs.
                             super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    uVar3 = file.field_2._8_8_;
    *(undefined8 *)(puVar21 + -0x38) = 0x107fc1;
    free((void *)uVar3);
    lVar26 = 0;
    do {
      plVar11 = (long *)puVar19[lVar26];
      local_160._M_buckets = (__buckets_ptr)0x0;
      local_160._M_bucket_count = (size_type)mp._M_h._M_buckets;
      local_160._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_160._M_element_count = (size_type)mp._M_h._M_before_begin._M_nxt;
      local_160._M_rehash_policy._4_4_ = mp._M_h._M_element_count._4_4_;
      local_160._M_rehash_policy._M_max_load_factor = (float)mp._M_h._M_element_count;
      local_160._M_rehash_policy._M_next_resize = mp._M_h._M_rehash_policy._0_8_;
      local_160._M_single_bucket = (__node_base_ptr)0x0;
      local_360._M_h = (__hashtable_alloc *)&local_160;
      *(undefined8 *)(puVar21 + -0x38) = 0x108036;
      std::
      _Hashtable<Data<4u>,std::pair<Data<4u>const,int>,std::allocator<std::pair<Data<4u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<4u>>,My_Hash<4u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign<std::_Hashtable<Data<4u>,std::pair<Data<4u>const,int>,std::allocator<std::pair<Data<4u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<4u>>,My_Hash<4u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<Data<4u>const,int>,true>>>>
                ((_Hashtable<Data<4u>,std::pair<Data<4u>const,int>,std::allocator<std::pair<Data<4u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<4u>>,My_Hash<4u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&local_160,
                 (_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)auStack_c8,&local_360);
      pcVar4 = *(code **)(*plVar11 + 0x30);
      *(undefined8 *)(puVar21 + -0x38) = 0x108047;
      (*pcVar4)(plVar11,&local_160,&ppbStack_88);
      *(undefined8 *)(puVar21 + -0x38) = 0x10804f;
      std::
      _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_160);
      lVar26 = lVar26 + 1;
    } while (lVar26 != 5);
    *(undefined8 *)(puVar21 + -0x38) = 0x108068;
    std::ofstream::ofstream(&local_360);
    lVar26 = 0;
    do {
      *(undefined8 *)(puVar21 + -0x38) = 0x108080;
      printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
      p_Var9 = mp._M_h._M_single_bucket;
      this = (Abstract<4U> *)puVar19[lVar26];
      *(undefined8 *)(puVar21 + -0x38) = 0x108097;
      Abstract<4U>::print_f1(this,(ofstream *)&local_360,(int)p_Var9);
      lVar26 = lVar26 + 1;
    } while (lVar26 != 5);
    lVar26 = 0;
    do {
      if ((long *)puVar19[lVar26] != (long *)0x0) {
        pcVar4 = *(code **)(*(long *)puVar19[lVar26] + 0x48);
        *(undefined8 *)(puVar21 + -0x38) = 0x1080b2;
        (*pcVar4)();
      }
      ppbVar7 = outs.
                super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar26 = lVar26 + 1;
      ppbVar20 = ppbStack_88;
    } while (lVar26 != 5);
    for (; ppbVar20 != ppbVar7; ppbVar20 = ppbVar20 + 1) {
      uVar3 = *(undefined8 *)(*(long *)*ppbVar20 + -0x18);
      cVar6 = (char)*ppbVar20;
      *(undefined8 *)(puVar21 + -0x38) = 0x1080df;
      std::ios::widen((char)uVar3 + cVar6);
      *(undefined8 *)(puVar21 + -0x38) = 0x1080ea;
      std::ostream::put(cVar6);
      *(undefined8 *)(puVar21 + -0x38) = 0x1080f2;
      std::ostream::flush();
    }
    local_360._M_h = local_110;
    *(undefined8 *)((long)&local_360._M_h + *(long *)(local_110 + -0x18)) = local_108;
    *(undefined8 *)(puVar21 + -0x38) = 0x108125;
    std::filebuf::~filebuf((filebuf *)&out);
    *(undefined8 *)(puVar21 + -0x38) = 0x108131;
    std::ios_base::~ios_base(local_268);
    *(undefined8 *)(puVar21 + -0x38) = 0x10813a;
    std::
    _Hashtable<Stream<4U>,_std::pair<const_Stream<4U>,_int>,_std::allocator<std::pair<const_Stream<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Stream<4U>_>,_Stream_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<Stream<4U>,_std::pair<const_Stream<4U>,_int>,_std::allocator<std::pair<const_Stream<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Stream<4U>_>,_Stream_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&cnt);
    *(undefined8 *)(puVar21 + -0x38) = 0x108146;
    std::
    _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)auStack_c8);
    psVar8 = local_f8;
    puVar21 = local_120;
    iVar23 = local_fc + 1;
  } while (iVar23 != 5);
  if (local_f8 != &file._M_string_length) {
    *(undefined8 *)(local_120 + -8) = 0x108183;
    operator_delete(psVar8,file._M_string_length + 1);
  }
  ppbVar7 = ppbStack_88;
  if (ppbStack_88 != (pointer)0x0) {
    uVar22 = (long)outs.
                   super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppbStack_88;
    *(undefined8 *)(puVar21 + -8) = 0x108198;
    operator_delete(ppbVar7,uVar22);
  }
  return;
}

Assistant:

void SuperSpread_Test_Hitter(string PATH) {
	std::vector<std::ostream*> outs(4);
	std::string file = "caida";
	outs[0] = new std::ofstream(RESULT_FOLDER + "superSpread_" + file + "_ARE.csv");
	outs[1] = new std::ofstream(RESULT_FOLDER + "superSpread_" + file + "_Recall Rate (RR).csv");
	outs[2] = new std::ofstream(RESULT_FOLDER + "superSpread_" + file + "_Precision Rate (PR).csv");
	outs[3] = new std::ofstream(RESULT_FOLDER + "superSpread_" + file + "_F1.csv");
	for (int i = 0; i < 5; ++i) {
		int memory = 6 * SuperSpread_BLOCK + SuperSpread_BLOCK * i;
		printf("\033[0m\033[1;4;36m> Memory size: %dKB\n\033[0m", memory / 1000);
		int SKETCH_NUM = 5;
		Abstract<DATA_LEN>* sketch[SKETCH_NUM];
		sketch[0] = new WavingSketch<8, 16, DATA_LEN>(memory, SuperSpread_HIT);
		sketch[1] = new TLF<DATA_LEN>(memory, SuperSpread_HIT);
		sketch[2] = new OLF<DATA_LEN>(memory, SuperSpread_HIT);
		sketch[3] = new OpenSketch<DATA_LEN>(memory, SuperSpread_HIT);
		sketch[4] = new SpreadSketchWrapper<DATA_LEN>(memory, SuperSpread_HIT);

		if (i == 0)
		{
			for (auto& out : outs)
			{
				*out << "MEM(KB)" << ",";
				for (uint32_t j = 0; j < SKETCH_NUM; j++)
				{
					*out << sketch[j]->name << ",";
				}
				*out << std::endl;
			}
		}
		for (auto& out : outs)
		{
			*out << memory / 1000 << ",";
		}

		HashMap<DATA_LEN> mp;
		StreamMap<DATA_LEN> sp;

		int cnt;
		Data<DATA_LEN>* records = read_standard_pair_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
		Data<DATA_LEN> from;
		Data<DATA_LEN> to;
		int num = 0;
		cnt = std::min(cnt, MAX_PACKET);
		while (num < cnt) {
			from = records[num * 2];
			to = records[num * 2 + 1];

			/*
			num++;
			if(num % 1000000 == 0){
				cout << num << endl;
			}
			*/

			Stream<DATA_LEN> stream(from, to);
			if (sp.find(stream) == sp.end()) {
				sp[stream] = 1;
				if (mp.find(from) == mp.end())
					mp[from] = 1;
				else
					mp[from] += 1;
			}
			for (int j = 0; j < SKETCH_NUM; ++j) {
				sketch[j]->Init(from, to);
			}
			num++;
		}
		free(records);
		for (int j = 0; j < SKETCH_NUM; ++j) {
			sketch[j]->Check(mp, outs);
		}

		ofstream out;

		for (int j = 0; j < SKETCH_NUM; ++j) {
			printf("\033[0m\033[1;36m|\033[0m\t");
			sketch[j]->print_f1(out, memory);
		}

		for (int j = 0; j < SKETCH_NUM; ++j) {
			delete sketch[j];
		}
		for (auto& out : outs)
		{
			*out << std::endl;
		}
	}
}